

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O3

void __thiscall PcodeOp::saveXml(PcodeOp *this,ostream *s)

{
  spacetype sVar1;
  Varnode *pVVar2;
  uintb uVar3;
  ostream *poVar4;
  pointer ppVVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  char local_51;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<op",3);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"code","");
  local_51 = ' ';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=\"",2);
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,">\n",2);
  SeqNum::saveXml(&this->start,s);
  local_50 = (char *)CONCAT71(local_50._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(s,(char *)&local_50,1);
  if (this->output == (Varnode *)0x0) {
    pcVar8 = "<void/>\n";
    lVar7 = 8;
    poVar4 = s;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(s,"<addr ref=\"0x",0xd);
    *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
         *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
    pcVar8 = "\"/>\n";
    lVar7 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
  ppVVar5 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar5) {
    uVar9 = 0;
    do {
      pVVar2 = ppVVar5[uVar9];
      poVar4 = s;
      if (pVVar2 == (Varnode *)0x0) {
LAB_0026fbf8:
        lVar7 = 8;
        pcVar8 = "<void/>\n";
      }
      else {
        sVar1 = ((pVVar2->loc).base)->type;
        if (sVar1 == IPTR_CONSTANT) {
          if ((uVar9 != 0) || ((this->opcode->opcode & ~CPUI_COPY) != CPUI_LOAD)) goto LAB_0026fc48;
          uVar3 = (pVVar2->loc).offset;
          std::__ostream_insert<char,std::char_traits<char>>(s,"<spaceid name=\"",0xf);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (s,*(char **)(uVar3 + 0x38),*(long *)(uVar3 + 0x40));
        }
        else {
          if (sVar1 == IPTR_IOP) {
            if ((uVar9 != 1) || (this->opcode->opcode != CPUI_INDIRECT)) goto LAB_0026fbf8;
            std::__ostream_insert<char,std::char_traits<char>>(s,"<iop",4);
            local_50 = local_40;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"value","");
            local_51 = ' ';
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_50,local_48);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"=\"0x",4);
            *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
                 *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
            if (local_50 != local_40) {
              operator_delete(local_50);
            }
            lVar7 = 3;
            pcVar8 = "/>\n";
            goto LAB_0026fc8d;
          }
LAB_0026fc48:
          std::__ostream_insert<char,std::char_traits<char>>(s,"<addr ref=\"0x",0xd);
          *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
               *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
        }
        lVar7 = 4;
        pcVar8 = "\"/>\n";
      }
LAB_0026fc8d:
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
      uVar9 = uVar9 + 1;
      ppVVar5 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->inrefs).
                                   super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                                   .super__Vector_impl_data._M_finish - (long)ppVVar5 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"</op>\n",6);
  return;
}

Assistant:

void PcodeOp::saveXml(ostream &s) const

{
  s << "<op";
  a_v_i(s,"code",(int4)code());
  s << ">\n";
  start.saveXml(s);
  s << '\n';
  if (output==(Varnode *)0)
    s << "<void/>\n";
  else
    s << "<addr ref=\"0x" << hex << output->getCreateIndex() << "\"/>\n";
  for(int4 i=0;i<inrefs.size();++i) {
    const Varnode *vn = getIn(i);
    if (vn == (const Varnode *)0)
      s << "<void/>\n";
    else if (vn->getSpace()->getType()==IPTR_IOP) {
      if ((i==1)&&(code()==CPUI_INDIRECT)) {
	PcodeOp *indop = PcodeOp::getOpFromConst(vn->getAddr());
	s << "<iop";
	a_v_u(s,"value",indop->getSeqNum().getTime());
	s << "/>\n";
      }
      else
	s << "<void/>\n";
    }
    else if (vn->getSpace()->getType()==IPTR_CONSTANT) {
      if ((i==0)&&((code()==CPUI_STORE)||(code()==CPUI_LOAD))) {
	AddrSpace *spc = Address::getSpaceFromConst(vn->getAddr());
	s << "<spaceid name=\"";
	s << spc->getName() << "\"/>\n";
      }
      else
	s << "<addr ref=\"0x" << hex << vn->getCreateIndex() << "\"/>\n";
    }
    else {
      s << "<addr ref=\"0x" << hex << vn->getCreateIndex() << "\"/>\n";
    }
  }
  s << "</op>\n";
}